

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O0

tuple_base<std::integer_sequence<unsigned_long,_0UL>,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>_>
* __thiscall
meta::impl::
tuple_base<std::integer_sequence<unsigned_long,0ul>,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>>
::operator=(tuple_base<std::integer_sequence<unsigned_long,0ul>,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>>
            *this,tuple<Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>_> *v)

{
  type_by_index_t<0UL,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>_> *v_00;
  tuple<Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>_> *v_local;
  tuple_base<std::integer_sequence<unsigned_long,_0UL>,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>_>
  *this_local;
  
  v_00 = get<0ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>>(v);
  tuple_value<0ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,false>::operator=
            ((tuple_value<0ul,Fixpp::FieldRef<Fixpp::TagT<269u,Fixpp::Type::Char>>,false> *)this,
             v_00);
  return (tuple_base<std::integer_sequence<unsigned_long,_0UL>,_Fixpp::FieldRef<Fixpp::TagT<269U,_Fixpp::Type::Char>_>_>
          *)this;
}

Assistant:

tuple_base& operator=( const tuple< Us... >& v )
        noexcept( seq::is_all< std::is_nothrow_assignable< Ts&, const Us& >::value... >::value )
      {
#ifdef FIXPP_META_FOLD_EXPRESSIONS
        ( tuple_value< Is, Ts >::operator=( get< Is >( v ) ), ... );
#else
        (void)swallow{ ( tuple_value< Is, Ts >::operator=( meta::get< Is >( v ) ), true )..., true };
#endif
        return *this;
      }